

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O0

char * xdg_get_path(char *xdg_env,char *default_path)

{
  int iVar1;
  char *pcVar2;
  char *path;
  size_t len;
  char *home;
  char *xdg_dir;
  char *default_path_local;
  char *xdg_env_local;
  
  if (((xdg_env != (char *)0x0) && (default_path != (char *)0x0)) && (*default_path != '/')) {
    if (((xdg_env == (char *)0x0) || (default_path == (char *)0x0)) || (*default_path == '/')) {
      xdg_env_local = (char *)0x0;
    }
    else {
      pcVar2 = getenv(xdg_env);
      if ((pcVar2 == (char *)0x0) || (*pcVar2 != '/')) {
        pcVar2 = get_home();
        if (pcVar2 == (char *)0x0) {
          xdg_env_local = (char *)0x0;
        }
        else {
          iVar1 = snprintf((char *)0x0,0,"%s/%s",pcVar2,default_path);
          xdg_env_local = (char *)calloc(1,(long)(iVar1 + 1));
          if (xdg_env_local == (char *)0x0) {
            free(pcVar2);
            xdg_env_local = (char *)0x0;
          }
          else {
            snprintf(xdg_env_local,(long)(iVar1 + 1),"%s/%s",pcVar2,default_path);
            free(pcVar2);
          }
        }
      }
      else {
        pcVar2 = ccopy(pcVar2);
        xdg_env_local = strip_slash(pcVar2);
      }
    }
    return xdg_env_local;
  }
  __assert_fail("xdg_env && default_path && default_path[0] != \'/\'",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/xdg.c",
                0x35,"char *xdg_get_path(const char *, const char *)");
}

Assistant:

char*
xdg_get_path(const char *xdg_env, const char *default_path)
{
   assert(xdg_env && default_path && default_path[0] != '/');

   if (!xdg_env || !default_path || default_path[0] == '/')
      return NULL;

   const char *xdg_dir;
   if ((xdg_dir = getenv(xdg_env)) && xdg_dir[0] == '/')
      return strip_slash(ccopy(xdg_dir));

   char *home;
   if (!(home = get_home()))
      return NULL; /** fatal! */

   const size_t len = snprintf(NULL, 0, "%s/%s", home, default_path) + 1;

   char *path;
   if (!(path = calloc(1, len))) {
      free(home);
      return NULL; /** fatal! */
   }

   snprintf(path, len, "%s/%s", home, default_path);
   free(home);
   return path;
}